

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

DynamicType * __thiscall
Js::PathTypeHandlerBase::PromoteType<false>
          (PathTypeHandlerBase *this,DynamicType *predecessorType,PathTypeSuccessorKey key,
          bool shareType,ScriptContext *scriptContext,DynamicObject *instance,
          PropertyIndex *propertyIndex)

{
  Type *addr;
  Type *pTVar1;
  Type *pTVar2;
  Type TVar3;
  PathTypeSuccessorInfo *this_00;
  Data *pDVar4;
  TypePath *pTVar5;
  RecyclerWeakReference<Js::DynamicObject> *pRVar6;
  RecyclableObject *pRVar7;
  code *pcVar8;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *pPVar9;
  TypePath *pTVar10;
  Recycler *pRVar11;
  ScriptContext *pSVar12;
  uint8 oldPathSize;
  bool bVar13;
  bool bVar14;
  byte bVar15;
  byte bVar16;
  PropertyTypes PVar17;
  PropertyIndex PVar18;
  int iVar19;
  PropertyId propertyId;
  undefined4 *puVar20;
  undefined4 extraout_var_00;
  PathTypeSetterSlotIndex *oldSetters;
  RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstanceBefore;
  TypePath *this_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  PathTypeHandlerBase *pPVar21;
  undefined6 extraout_var;
  PathTypeHandlerWithAttr *this_02;
  DynamicType *pDVar22;
  RecyclerWeakReferenceBase *weakRef;
  byte bVar23;
  undefined7 in_register_00000009;
  uint uVar24;
  ushort uVar25;
  uint uVar26;
  char16_t *this_03;
  PathTypeHandlerBase *this_04;
  char *instance_00;
  char cVar27;
  Type *pTVar28;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *local_b8;
  JavascriptLibrary *local_b0;
  RecyclerWeakReference<Js::DynamicType> *local_a8;
  RecyclerWeakReference<Js::DynamicType> *nextTypeWeakRef;
  DynamicObject *local_98;
  DynamicType *local_90;
  ulong local_88;
  TypePath *local_80;
  undefined4 local_78;
  uint local_74;
  PathTypeHandlerBase *local_70;
  PropertyRecord *local_68;
  PathTypeSetterSlotIndex *local_60;
  Recycler *local_58;
  undefined8 local_50;
  ScriptContext *local_48;
  DynamicType *local_40;
  uint16 local_36;
  int local_34;
  undefined4 extraout_var_01;
  undefined4 extraout_var_04;
  
  local_78 = (undefined4)CONCAT71(in_register_00000009,shareType);
  local_48 = scriptContext;
  if (propertyIndex == (PropertyIndex *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar20 = 1;
    bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                 ,0x7d1,"(propertyIndex != nullptr)","propertyIndex != nullptr");
    if (!bVar13) goto LAB_00dd7ae6;
    *puVar20 = 0;
  }
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar20 = 1;
    bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                 ,0x7d2,"(isObjectLiteral || instance != nullptr)",
                                 "isObjectLiteral || instance != nullptr");
    if (!bVar13) goto LAB_00dd7ae6;
    *puVar20 = 0;
  }
  local_88 = (ulong)key >> 0x20;
  local_b0 = (local_48->super_ScriptContextBase).javascriptLibrary;
  local_58 = local_48->recycler;
  local_a8 = (RecyclerWeakReference<Js::DynamicType> *)0x0;
  local_68 = ScriptContext::GetPropertyName(local_48,key.propertyId);
  this_00 = (this->successorInfo).ptr;
  if (this_00 == (PathTypeSuccessorInfo *)0x0) {
    local_a8 = (RecyclerWeakReference<Js::DynamicType> *)0x0;
LAB_00dd6f95:
    local_80 = (this->typePath).ptr;
    local_34 = CONCAT31(local_34._1_3_,((local_80->data).ptr)->pathSize);
    local_98 = instance;
    local_90 = predecessorType;
    iVar19 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])(this);
    local_40 = (DynamicType *)CONCAT44(extraout_var_00,iVar19);
    iVar19 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6f])(this);
    oldSetters = (PathTypeSetterSlotIndex *)CONCAT44(extraout_var_01,iVar19);
    pDVar4 = (((this->typePath).ptr)->data).ptr;
    bVar15 = pDVar4->pathLength;
    uVar25 = (this->super_DynamicTypeHandler).unusedBytes >> 1;
    if (uVar25 < bVar15) {
      this_03 = L"branching";
      local_50 = (DynamicType *)((ulong)local_50._4_4_ << 0x20);
    }
    else {
      local_50 = (DynamicType *)
                 CONCAT44(local_50._4_4_,
                          (int)CONCAT71((int7)((ulong)pDVar4 >> 8),bVar15 == pDVar4->pathSize));
      this_03 = L"advancing";
    }
    nextTypeWeakRef = (RecyclerWeakReference<Js::DynamicType> *)key;
    local_70 = this;
    bVar13 = HasSingletonInstance(this);
    if (bVar13) {
      oldSingletonInstanceBefore = (((this->typePath).ptr)->singletonInstance).ptr;
    }
    else {
      oldSingletonInstanceBefore = (RecyclerWeakReference<Js::DynamicObject> *)0x0;
    }
    TraceFixedFieldsBeforeTypeHandlerChange
              (this_03,L"PathTypeHandler",L"PathTypeHandler",local_98,
               &this->super_DynamicTypeHandler,local_90,oldSingletonInstanceBefore);
    pDVar22 = local_40;
    pRVar11 = local_58;
    pPVar21 = local_70;
    this_01 = local_80;
    cVar27 = (char)local_88;
    if (uVar25 < bVar15) {
      uVar24 = (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1);
      bVar13 = (bool)((DAT_015d6345 ^ 1) & ((this->super_DynamicTypeHandler).flags & 0x18) != 0);
      pPVar21 = (PathTypeHandlerBase *)(this->typePath).ptr;
      if (oldSetters == (PathTypeSetterSlotIndex *)0x0) {
        this_01 = TypePath::Branch<false>
                            ((TypePath *)pPVar21,local_58,uVar24,bVar13,(ObjectSlotAttributes *)0x0)
        ;
        pDVar22 = local_40;
      }
      else {
        this_01 = TypePath::Branch<true>
                            ((TypePath *)pPVar21,local_58,uVar24,bVar13,
                             (ObjectSlotAttributes *)local_40);
      }
      local_48->branchCount = local_48->branchCount + 1;
      if (cVar27 == '\a' && pDVar22 == (DynamicType *)0x0) {
        local_50 = (DynamicType *)0x0;
      }
      else {
        local_50 = (DynamicType *)
                   UpdateAttributes(pPVar21,local_58,(ObjectSlotAttributes *)pDVar22,(uint8)local_34
                                    ,((this_01->data).ptr)->pathSize);
      }
      if (cVar27 == -9 || oldSetters != (PathTypeSetterSlotIndex *)0x0) {
        local_60 = UpdateSetterSlots(this,local_58,oldSetters,(uint8)local_34,
                                     ((this_01->data).ptr)->pathSize);
      }
      else {
        local_60 = (PathTypeSetterSlotIndex *)0x0;
      }
      pPVar21 = this;
      if (DAT_015d6361 == 1) {
        bVar13 = DynamicTypeHandler::ShouldFixAnyProperties();
        if ((!bVar13) &&
           ((((this->typePath).ptr)->singletonInstance).ptr !=
            (RecyclerWeakReference<Js::DynamicObject> *)0x0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar20 = 1;
          bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                       ,0x816,"(this->HasSingletonInstanceOnlyIfNeeded())",
                                       "this->HasSingletonInstanceOnlyIfNeeded()");
          if (!bVar13) goto LAB_00dd7ae6;
          *puVar20 = 0;
        }
        pTVar5 = (this->typePath).ptr;
        pRVar6 = (pTVar5->singletonInstance).ptr;
        if ((pRVar6 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
           ((DynamicObject *)(pRVar6->super_RecyclerWeakReferenceBase).strongRef == local_98)) {
          (pTVar5->singletonInstance).ptr = (RecyclerWeakReference<Js::DynamicObject> *)0x0;
        }
      }
    }
    else if ((char)local_50 == '\0') {
      oldPathSize = (uint8)local_34;
      local_50 = local_40;
      if (local_40 == (DynamicType *)0x0 && cVar27 != '\a') {
        local_50 = (DynamicType *)
                   UpdateAttributes((PathTypeHandlerBase *)this_03,local_58,
                                    (ObjectSlotAttributes *)0x0,(uint8)local_34,
                                    ((local_80->data).ptr)->pathSize);
      }
      local_60 = oldSetters;
      if (oldSetters == (PathTypeSetterSlotIndex *)0x0 && cVar27 == -9) {
        local_60 = UpdateSetterSlots(pPVar21,local_58,(PathTypeSetterSlotIndex *)0x0,oldPathSize,
                                     ((this_01->data).ptr)->pathSize);
      }
    }
    else {
      this_04 = (PathTypeHandlerBase *)(local_70->typePath).ptr;
      this_01 = TypePath::Grow((TypePath *)this_04,local_58);
      if (cVar27 == '\a' && local_40 == (DynamicType *)0x0) {
        local_50 = (DynamicType *)0x0;
      }
      else {
        local_50 = (DynamicType *)
                   UpdateAttributes(this_04,pRVar11,(ObjectSlotAttributes *)local_40,(uint8)local_34
                                    ,((this_01->data).ptr)->pathSize);
      }
      if (cVar27 == -9 || oldSetters != (PathTypeSetterSlotIndex *)0x0) {
        local_60 = UpdateSetterSlots(pPVar21,pRVar11,oldSetters,(uint8)local_34,
                                     ((this_01->data).ptr)->pathSize);
      }
      else {
        local_60 = (PathTypeSetterSlotIndex *)0x0;
      }
      pDVar22 = local_40;
      pTVar5 = (pPVar21->typePath).ptr;
      local_80 = (TypePath *)__tls_get_addr(&PTR_0155fe48);
      do {
        (*(pPVar21->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6a])(pPVar21,this_01);
        if ((pDVar22 != (DynamicType *)0x0) &&
           (iVar19 = (*(pPVar21->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])(pPVar21),
           (DynamicType *)CONCAT44(extraout_var_02,iVar19) == pDVar22)) {
          (*(pPVar21->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6d])(pPVar21,local_50);
        }
        if ((oldSetters != (PathTypeSetterSlotIndex *)0x0) &&
           (iVar19 = (*(pPVar21->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6f])(pPVar21),
           (PathTypeSetterSlotIndex *)CONCAT44(extraout_var_03,iVar19) == oldSetters)) {
          (*(pPVar21->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x72])(pPVar21,local_60);
        }
        pDVar22 = (pPVar21->predecessorType).ptr;
        if (pDVar22 == (DynamicType *)0x0) {
          bVar13 = false;
        }
        else {
          iVar19 = (*((pDVar22->typeHandler).ptr)->_vptr_DynamicTypeHandler[0x4e])();
          if (iVar19 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            pTVar10 = local_80;
            *(undefined4 *)&(local_80->data).ptr = 1;
            bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                         ,0x844,
                                         "(currPredecessorType->GetTypeHandler()->IsPathTypeHandler())"
                                         ,
                                         "currPredecessorType->GetTypeHandler()->IsPathTypeHandler()"
                                        );
            if (!bVar13) goto LAB_00dd7ae6;
            *(undefined4 *)&(pTVar10->data).ptr = 0;
          }
          pPVar21 = FromTypeHandler((pDVar22->typeHandler).ptr);
          bVar13 = (pPVar21->typePath).ptr == pTVar5;
        }
        pDVar22 = local_40;
      } while (bVar13);
      cVar27 = (char)local_88;
      pPVar21 = local_70;
    }
    if (cVar27 == -9) {
      local_34 = TypePath::AddInternal<false>(this_01,local_68);
    }
    else {
      local_34 = TypePath::AddInternal<true>(this_01,local_68);
    }
    uVar26 = ((pPVar21->super_DynamicTypeHandler).unusedBytes >> 1) + 1;
    uVar24 = (pPVar21->super_DynamicTypeHandler).slotCapacity;
    uVar25 = (ushort)uVar26;
    if (uVar25 <= (ushort)uVar24) {
      uVar26 = uVar24;
    }
    local_74 = (uint)(pPVar21->super_DynamicTypeHandler).inlineSlotCapacity;
    TVar3 = (pPVar21->super_DynamicTypeHandler).offsetOfInlineSlots;
    bVar13 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler
                       (&pPVar21->super_DynamicTypeHandler);
    local_36 = TVar3;
    if ((bVar13) && ((pPVar21->super_DynamicTypeHandler).slotCapacity < (int)(uVar26 & 0xffff))) {
      PVar18 = DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
      local_74 = local_74 - (int)CONCAT62(extraout_var,PVar18);
      local_36 = 0x20;
    }
    bVar13 = (bool)(DAT_015d6361 ^ 1 | (byte)local_78);
    cVar27 = (char)local_88;
    local_80 = this_01;
    if (local_40 == (DynamicType *)0x0 && cVar27 == '\a') {
      this_02 = (PathTypeHandlerWithAttr *)
                PathTypeHandlerNoAttr::New
                          (local_48,this_01,uVar25,(PropertyIndex)uVar26,(uint16)local_74,local_36,
                           true,bVar13,local_90);
    }
    else {
      local_40 = (DynamicType *)CONCAT71(local_40._1_7_,cVar27 == -9);
      iVar19 = (*(local_70->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x71])();
      *(char *)((long)&(local_50->super_Type).typeId + (ulong)(PropertyIndex)local_34) = cVar27;
      this_02 = PathTypeHandlerWithAttr::New
                          (local_48,this_01,(ObjectSlotAttributes *)local_50,local_60,
                           (char)iVar19 + (char)local_40,uVar25,(PropertyIndex)uVar26,
                           (uint16)local_74,local_36,true,bVar13,local_90);
    }
    if (bVar13 == false) {
      DynamicTypeHandler::SetFlags((DynamicTypeHandler *)this_02,'\b');
    }
    bVar15 = DynamicTypeHandler::GetPropertyTypes((DynamicTypeHandler *)this_02);
    pPVar21 = local_70;
    if ((bVar15 & 0x10) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar20 = 1;
      bVar14 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                   ,0x87e,"(nextPath->GetHasOnlyWritableDataProperties())",
                                   "nextPath->GetHasOnlyWritableDataProperties()");
      if (!bVar14) goto LAB_00dd7ae6;
      *puVar20 = 0;
    }
    PVar17 = DynamicTypeHandler::GetPropertyTypes(&pPVar21->super_DynamicTypeHandler);
    DynamicTypeHandler::CopyPropertyTypes((DynamicTypeHandler *)this_02,0xb0,PVar17);
    PVar17 = DynamicTypeHandler::GetPropertyTypes(&pPVar21->super_DynamicTypeHandler);
    DynamicTypeHandler::SetPropertyTypes((DynamicTypeHandler *)this_02,'@',PVar17);
    if ((byte)local_78 != '\0') {
      AddBlankFieldAt((PathTypeHandlerBase *)this_02,local_68->pid,(PropertyIndex)local_34,local_48)
      ;
    }
    if ((uint)nextTypeWeakRef == 0x67) {
      (this_02->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.hasUserDefinedCtor = true;
    }
    if ((uint)nextTypeWeakRef < 0x10) {
      (this_02->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.hasInternalProperty = true;
    }
    iVar19 = ((pPVar21->super_DynamicTypeHandler).unusedBytes >> 1) + 1;
    if (iVar19 < local_48->maxPathLength) {
      iVar19 = local_48->maxPathLength;
    }
    local_48->maxPathLength = iVar19;
    iVar19 = (*(local_98->super_RecyclableObject).super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x67])();
    pDVar22 = (DynamicType *)CONCAT44(extraout_var_04,iVar19);
    pRVar7 = (local_90->super_Type).prototype.ptr;
    addr = &(pDVar22->super_Type).prototype;
    Memory::Recycler::WBSetBit((char *)addr);
    (pDVar22->super_Type).prototype.ptr = pRVar7;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    Memory::Recycler::WBSetBit((char *)&pDVar22->typeHandler);
    (pDVar22->typeHandler).ptr = (DynamicTypeHandler *)this_02;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&pDVar22->typeHandler);
    DynamicType::SetIsLocked(pDVar22);
    if (bVar13 != false) {
      DynamicType::SetIsShared(pDVar22);
    }
    pRVar11 = local_58;
    local_40 = pDVar22;
    weakRef = Memory::WeakReferenceHashTable<PrimePolicy>::Add
                        (&local_58->weakReferenceMap,(char *)pDVar22,local_58);
    if (weakRef->typeInfo == (Type)0x0) {
      weakRef->typeInfo = (Type)&DynamicType::typeinfo;
      Memory::Recycler::TrackAllocWeakRef(pRVar11,weakRef);
    }
    this = local_70;
    pDVar22 = local_90;
    instance_00 = (char *)local_70;
    SetSuccessor(local_70,local_90,(PathTypeSuccessorKey)nextTypeWeakRef,
                 (RecyclerWeakReference<Js::DynamicType> *)weakRef,local_48);
    if ((this_02->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
        unusedBytes >> 1 != (ushort)((local_80->data).ptr)->pathLength) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar20 = 1;
      instance_00 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
      ;
      bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                   ,0x8aa,
                                   "(nextPath->GetPathLength() == newTypePath->GetPathLength())",
                                   "nextPath->GetPathLength() == newTypePath->GetPathLength()");
      if (!bVar13) goto LAB_00dd7ae6;
      *puVar20 = 0;
    }
    if ((DAT_015d6361 == 1 && (byte)local_78 == '\0') &&
       ((this_02->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
        unusedBytes >> 1 <= (ushort)((local_80->data).ptr)->maxInitializedLength)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar20 = 1;
      instance_00 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
      ;
      bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                   ,0x8ac,
                                   "(!FixPropsOnPathTypes() || shareType || nextPath->GetPathLength() > newTypePath->GetMaxInitializedLength())"
                                   ,
                                   "!FixPropsOnPathTypes() || shareType || nextPath->GetPathLength() > newTypePath->GetMaxInitializedLength()"
                                  );
      if (!bVar13) goto LAB_00dd7ae6;
      *puVar20 = 0;
    }
    TraceFixedFieldsAfterTypeHandlerChange
              ((DynamicObject *)instance_00,&this->super_DynamicTypeHandler,
               (DynamicTypeHandler *)this_02,pDVar22,local_40,oldSingletonInstanceBefore);
    local_48->promoteCount = local_48->promoteCount + 1;
  }
  else {
    bVar13 = PathTypeSuccessorInfo::GetSuccessor(this_00,key,&local_a8);
    if ((!bVar13) ||
       (local_40 = (DynamicType *)(local_a8->super_RecyclerWeakReferenceBase).strongRef,
       local_40 == (DynamicType *)0x0)) goto LAB_00dd6f95;
    local_48->cacheCount = local_48->cacheCount + 1;
    this_02 = (PathTypeHandlerWithAttr *)(local_40->typeHandler).ptr;
    if (((this_02->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
         propertyTypes & 0x40) >> 6 != ((this->super_DynamicTypeHandler).propertyTypes & 0x40) >> 6)
    {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar20 = 1;
      bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                   ,0x8c3,
                                   "(nextPath->GetIsInlineSlotCapacityLocked() == this->GetIsInlineSlotCapacityLocked())"
                                   ,
                                   "nextPath->GetIsInlineSlotCapacityLocked() == this->GetIsInlineSlotCapacityLocked()"
                                  );
      if (!bVar13) goto LAB_00dd7ae6;
      *puVar20 = 0;
    }
    pDVar22 = local_40;
    local_34 = (*(this_02->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                 super_DynamicTypeHandler._vptr_DynamicTypeHandler[0xc])(this_02,local_68);
    if (((DAT_015d6361 != 1) ||
        (((this_02->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
          flags & 8) == 0)) &&
       ((((this_02->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
          flags & 0x10) == 0 || (pDVar22->isShared == false)))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar20 = 1;
      bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                   ,0x8c8,
                                   "((FixPropsOnPathTypes() && nextPath->GetMayBecomeShared()) || (nextPath->GetIsShared() && nextType->GetIsShared()))"
                                   ,
                                   "(FixPropsOnPathTypes() && nextPath->GetMayBecomeShared()) || (nextPath->GetIsShared() && nextType->GetIsShared())"
                                  );
      if (!bVar13) goto LAB_00dd7ae6;
      *puVar20 = 0;
      pDVar22 = local_40;
    }
    pSVar12 = local_48;
    if ((DAT_015d6361 == 1) && (pDVar22->isShared == false)) {
      if (((this_02->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler
           .flags & 0x10) == 0) {
        AddBlankFieldAt((PathTypeHandlerBase *)this_02,local_68->pid,(PropertyIndex)local_34,
                        local_48);
        pDVar22 = local_40;
        DoShareTypeHandlerInternal<true>((PathTypeHandlerBase *)this_02,pSVar12);
      }
      DynamicType::ShareType(pDVar22);
    }
  }
  if ((DAT_015d6345 == 1) &&
     (bVar15 = (this->super_DynamicTypeHandler).flags, (bVar15 & 0x20) != 0 && (bVar15 & 0x18) != 0)
     ) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar20 = 1;
    bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                 ,0x8d5,
                                 "(!IsolatePrototypes() || !GetIsOrMayBecomeShared() || !GetIsPrototype())"
                                 ,
                                 "!IsolatePrototypes() || !GetIsOrMayBecomeShared() || !GetIsPrototype()"
                                );
    if (!bVar13) goto LAB_00dd7ae6;
    *puVar20 = 0;
  }
  DynamicTypeHandler::SetFlags
            ((DynamicTypeHandler *)this_02,(this->super_DynamicTypeHandler).flags & 0x20);
  bVar15 = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
  bVar16 = DynamicTypeHandler::GetPropertyTypes((DynamicTypeHandler *)this_02);
  bVar23 = (byte)local_88 & 0x14;
  if ((bVar23 == 4 & (bVar16 ^ bVar15) >> 4) == 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar20 = 1;
    bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                 ,0x8d7,
                                 "(this->GetHasOnlyWritableDataProperties() == nextPath->GetHasOnlyWritableDataProperties() || !(key.GetAttributes() & ObjectSlotAttr_Writable) || (key.GetAttributes() & ObjectSlotAttr_Accessor))"
                                 ,
                                 "this->GetHasOnlyWritableDataProperties() == nextPath->GetHasOnlyWritableDataProperties() || !(key.GetAttributes() & ObjectSlotAttr_Writable) || (key.GetAttributes() & ObjectSlotAttr_Accessor)"
                                );
    if (!bVar13) goto LAB_00dd7ae6;
    *puVar20 = 0;
  }
  if (((this->super_DynamicTypeHandler).propertyTypes & 0x40) >> 6 !=
      ((this_02->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
       propertyTypes & 0x40) >> 6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar20 = 1;
    bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                 ,0x8d8,
                                 "(this->GetIsInlineSlotCapacityLocked() == nextPath->GetIsInlineSlotCapacityLocked())"
                                 ,
                                 "this->GetIsInlineSlotCapacityLocked() == nextPath->GetIsInlineSlotCapacityLocked()"
                                );
    if (!bVar13) goto LAB_00dd7ae6;
    *puVar20 = 0;
  }
  PVar17 = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
  DynamicTypeHandler::SetPropertyTypes((DynamicTypeHandler *)this_02,0xa0,PVar17);
  pTVar2 = &local_b0->typesWithOnlyWritablePropertyProtoChain;
  Memory::Recycler::WBSetBit((char *)&local_b8);
  local_b8 = (PrototypeChainCache<Js::NoSpecialPropertyCache> *)pTVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_b8);
  pPVar9 = local_b8;
  if ((bVar23 != 4) &&
     (DynamicTypeHandler::SetHasOnlyWritableDataProperties((DynamicTypeHandler *)this_02,false),
     pSVar12 = local_48,
     ((this_02->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
      flags & 0x20) != 0)) {
    propertyId = DynamicTypeHandler::TMapKey_GetPropertyId(local_48,local_68);
    ScriptContext::InvalidateStoreFieldCaches(pSVar12,propertyId);
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
              ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)pPVar9);
  }
  pTVar28 = &local_b0->typesWithNoSpecialPropertyProtoChain;
  Memory::Recycler::WBSetBit((char *)&local_b8);
  local_b8 = pTVar28;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_b8);
  pPVar9 = local_b8;
  bVar13 = NoSpecialPropertyCache::IsSpecialProperty(local_68);
  if ((bVar13) &&
     (pTVar1 = &(this_02->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                super_DynamicTypeHandler.propertyTypes, *pTVar1 = *pTVar1 | 0x80,
     ((this_02->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
      flags & 0x20) != 0)) {
    PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear(pPVar9);
  }
  *propertyIndex = (PropertyIndex)local_34;
  if ((PathTypeHandlerBase *)
      (((this_02->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.predecessorType.ptr)->
      typeHandler).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar20 = 1;
    bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                 ,0x8e2,"(nextPath->GetPredecessorType()->GetTypeHandler() == this)"
                                 ,"Promoting this type to a successor with a different predecessor?"
                                );
    if (!bVar13) {
LAB_00dd7ae6:
      pcVar8 = (code *)invalidInstructionException();
      (*pcVar8)();
    }
    *puVar20 = 0;
  }
  return local_40;
}

Assistant:

DynamicType* PathTypeHandlerBase::PromoteType(DynamicType* predecessorType, const PathTypeSuccessorKey key, bool shareType, ScriptContext* scriptContext, DynamicObject* instance, PropertyIndex* propertyIndex)
    {
        Assert(propertyIndex != nullptr);
        Assert(isObjectLiteral || instance != nullptr);

        JavascriptLibrary* library = scriptContext->GetLibrary();
        Recycler* recycler = scriptContext->GetRecycler();
        PropertyIndex index;
        DynamicType * nextType;
        RecyclerWeakReference<DynamicType>* nextTypeWeakRef = nullptr;
        const PropertyRecord *propertyRecord = scriptContext->GetPropertyName(key.GetPropertyId());

        PathTypeHandlerBase * nextPath;
        if (!GetSuccessor(key, &nextTypeWeakRef) || (nextType = nextTypeWeakRef->Get()) == nullptr)
        {
            TypePath * newTypePath = GetTypePath();
            uint8 oldPathSize = GetTypePath()->GetPathSize();

            ObjectSlotAttributes *oldAttributes = GetAttributeArray();
            ObjectSlotAttributes *newAttributes = oldAttributes;
            PathTypeSetterSlotIndex *oldSetters = GetSetterSlots();
            PathTypeSetterSlotIndex *newSetters = oldSetters;

            bool branching = GetTypePath()->GetPathLength() > GetPathLength();
            bool growing = !branching && GetTypePath()->GetPathLength() == GetTypePath()->GetPathSize();

#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            DynamicType* oldType = predecessorType;
            RecyclerWeakReference<DynamicObject>* oldSingletonInstance = GetSingletonInstance();
            TraceFixedFieldsBeforeTypeHandlerChange(branching ? _u("branching") : _u("advancing"), _u("PathTypeHandler"), _u("PathTypeHandler"), instance, this, oldType, oldSingletonInstance);
#endif
#endif

            if (branching)
            {
                // We need to branch the type path.

                if (oldSetters)
                {
                    newTypePath = GetTypePath()->Branch<true>(recycler, GetPathLength(), GetIsOrMayBecomeShared() && !IsolatePrototypes(), oldAttributes);
                }
                else
                {
                    newTypePath = GetTypePath()->Branch<false>(recycler, GetPathLength(), GetIsOrMayBecomeShared() && !IsolatePrototypes());
                }

#ifdef PROFILE_TYPES
                scriptContext->branchCount++;
#endif
#ifdef PROFILE_OBJECT_LITERALS
                if (isObjectLiteral)
                {
                    scriptContext->objectLiteralBranchCount++;
                }
#endif

                if (key.GetAttributes() != ObjectSlotAttr_Default || oldAttributes != nullptr)
                {
                    newAttributes = this->UpdateAttributes(recycler, oldAttributes, oldPathSize, newTypePath->GetPathSize());
                }

                if ((key.GetAttributes() == ObjectSlotAttr_Setter) || oldSetters != nullptr)
                {
                    newSetters = this->UpdateSetterSlots(recycler, oldSetters, oldPathSize, newTypePath->GetPathSize());
                }

#if ENABLE_FIXED_FIELDS
#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
                if (PathTypeHandlerBase::FixPropsOnPathTypes())
                {
                    Assert(this->HasSingletonInstanceOnlyIfNeeded());
                    this->GetTypePath()->ClearSingletonInstanceIfSame(instance);
                }
#endif
#endif
            }
            else if (growing)
            {
                // We need to grow the type path.

                newTypePath = GetTypePath()->Grow(recycler);

                if (key.GetAttributes() != ObjectSlotAttr_Default || oldAttributes != nullptr)
                {
                    newAttributes = this->UpdateAttributes(recycler, oldAttributes, oldPathSize, newTypePath->GetPathSize());
                }

                if ((key.GetAttributes() == ObjectSlotAttr_Setter) || oldSetters != nullptr)
                {
                    newSetters = this->UpdateSetterSlots(recycler, oldSetters, oldPathSize, newTypePath->GetPathSize());
                }

                // Update all the predecessor types that use this TypePath to the new TypePath.
                // This will allow the old TypePath to be collected, and will ensure that the
                // fixed field info is correct for those types.

                PathTypeHandlerBase * typeHandlerToUpdate = this;
                TypePath * oldTypePath = GetTypePath();
                while (true)
                {
                    typeHandlerToUpdate->SetTypePath(newTypePath);
                    if (oldAttributes && typeHandlerToUpdate->GetAttributeArray() == oldAttributes)
                    {
                        typeHandlerToUpdate->SetAttributeArray(newAttributes);
                    }
                    if (oldSetters && typeHandlerToUpdate->GetSetterSlots() == oldSetters)
                    {
                        typeHandlerToUpdate->SetSetterSlots(newSetters);
                    }

                    DynamicType * currPredecessorType = typeHandlerToUpdate->GetPredecessorType();
                    if (currPredecessorType == nullptr)
                    {
                        break;
                    }

                    Assert(currPredecessorType->GetTypeHandler()->IsPathTypeHandler());
                    typeHandlerToUpdate = PathTypeHandlerBase::FromTypeHandler(currPredecessorType->GetTypeHandler());
                    if (typeHandlerToUpdate->GetTypePath() != oldTypePath)
                    {
                        break;
                    }
                }
            }
            else
            {
                if (key.GetAttributes() != ObjectSlotAttr_Default && oldAttributes == nullptr)
                {
                    newAttributes = this->UpdateAttributes(recycler, nullptr, oldPathSize, newTypePath->GetPathSize());
                }

                if ((key.GetAttributes() == ObjectSlotAttr_Setter) && oldSetters == nullptr)
                {
                    newSetters = this->UpdateSetterSlots(recycler, nullptr, oldPathSize, newTypePath->GetPathSize());
                }
            }

            bool isSetterProperty = key.GetAttributes() == ObjectSlotAttr_Setter;
            if (isSetterProperty)
            {
                // Not actually adding a property ID to the type path map here.
                index = (PropertyIndex)newTypePath->AddInternal<false>(propertyRecord);
            }
            else
            {
                index = (PropertyIndex)newTypePath->AddInternal<true>(propertyRecord);
            }

            const PropertyIndex newPropertyCount = GetPathLength() + 1;
            const PropertyIndex newSlotCapacity = max(newPropertyCount, static_cast<PropertyIndex>(GetSlotCapacity()));
            PropertyIndex newInlineSlotCapacity = GetInlineSlotCapacity();
            uint16 newOffsetOfInlineSlots = GetOffsetOfInlineSlots();
            if(IsObjectHeaderInlinedTypeHandler() && newSlotCapacity > GetSlotCapacity())
            {
                newInlineSlotCapacity -= GetObjectHeaderInlinableSlotCapacity();
                newOffsetOfInlineSlots = sizeof(DynamicObject);
            }
#if ENABLE_FIXED_FIELDS
            bool markTypeAsShared = !FixPropsOnPathTypes() || shareType;
#else
            bool markTypeAsShared = true;
#endif

            if (key.GetAttributes() == ObjectSlotAttr_Default && oldAttributes == nullptr)
            {
                nextPath = PathTypeHandlerNoAttr::New(scriptContext, newTypePath, newPropertyCount, newSlotCapacity, newInlineSlotCapacity, newOffsetOfInlineSlots, true, markTypeAsShared, predecessorType);
            }
            else
            {
                PathTypeSetterSlotIndex newSetterCount = GetSetterCount() + isSetterProperty;
                newAttributes[index] = key.GetAttributes();
                nextPath = PathTypeHandlerWithAttr::New(scriptContext, newTypePath, newAttributes, newSetters, newSetterCount, newPropertyCount, newSlotCapacity, newInlineSlotCapacity, newOffsetOfInlineSlots, true, markTypeAsShared, predecessorType);
            }
            if (!markTypeAsShared) nextPath->SetMayBecomeShared();
            Assert(nextPath->GetHasOnlyWritableDataProperties());
            nextPath->CopyPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, GetPropertyTypes());
            nextPath->SetPropertyTypes(PropertyTypesInlineSlotCapacityLocked, GetPropertyTypes());

#if ENABLE_FIXED_FIELDS
            if (shareType)
            {
                nextPath->AddBlankFieldAt(propertyRecord->GetPropertyId(), index, scriptContext);
            }
#endif

            if (key.GetPropertyId() == PropertyIds::constructor)
            {
                nextPath->hasUserDefinedCtor = true;
            }

            if (IsInternalPropertyId(key.GetPropertyId()))
            {
                nextPath->hasInternalProperty = true;
            }

#ifdef PROFILE_TYPES
            scriptContext->maxPathLength = max(GetPathLength() + 1, scriptContext->maxPathLength);
#endif

            if (isObjectLiteral)
            {
                // The new type isn't shared yet.  We will make it shared when the second instance attains it.
                nextType = RecyclerNew(recycler, DynamicType, predecessorType, nextPath, /* isLocked = */ true, /* isShared = */ markTypeAsShared);
            }
            else
            {
                // The new type isn't shared yet.  We will make it shared when the second instance attains it.
                nextType = instance->DuplicateType();
                // nextType's prototype and predecessorType's prototype can only be different here
                // only for SetPrototype scenario where predecessorType is the cachedType with newPrototype
                nextType->SetPrototype(predecessorType->GetPrototype());
                nextType->typeHandler = nextPath;
                markTypeAsShared ? nextType->SetIsLockedAndShared() : nextType->SetIsLocked();
            }

            SetSuccessor(predecessorType, key, recycler->CreateWeakReferenceHandle<DynamicType>(nextType), scriptContext);
            // We just extended the current type path to a new tip or created a brand new type path.  We should
            // be at the tip of the path and there should be no instances there yet.
            Assert(nextPath->GetPathLength() == newTypePath->GetPathLength());
#if ENABLE_FIXED_FIELDS
            Assert(!FixPropsOnPathTypes() || shareType || nextPath->GetPathLength() > newTypePath->GetMaxInitializedLength());
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            TraceFixedFieldsAfterTypeHandlerChange(instance, this, nextPath, oldType, nextType, oldSingletonInstance);
#endif
#endif
#ifdef PROFILE_TYPES
            scriptContext->promoteCount++;
#endif
#ifdef PROFILE_OBJECT_LITERALS
            if (isObjectLiteral)
            {
                scriptContext->objectLiteralPromoteCount++;
            }
#endif
        }
        else
        {
#ifdef PROFILE_TYPES
            scriptContext->cacheCount++;
#endif

            // Now that the second (or subsequent) instance reached this type, make sure that it's shared.
            nextPath = (PathTypeHandlerBase *)nextType->GetTypeHandler();
            Assert(nextPath->GetIsInlineSlotCapacityLocked() == this->GetIsInlineSlotCapacityLocked());

            index = nextPath->GetPropertyIndex(propertyRecord);

#if ENABLE_FIXED_FIELDS
            Assert((FixPropsOnPathTypes() && nextPath->GetMayBecomeShared()) || (nextPath->GetIsShared() && nextType->GetIsShared()));
            if (FixPropsOnPathTypes() && !nextType->GetIsShared())
            {
                if (!nextPath->GetIsShared())
                {
                    nextPath->AddBlankFieldAt(propertyRecord->GetPropertyId(), index, scriptContext);
                    nextPath->DoShareTypeHandlerInternal<true>(scriptContext);
                }
                nextType->ShareType();
            }
#endif
        }

        Assert(!IsolatePrototypes() || !GetIsOrMayBecomeShared() || !GetIsPrototype());
        nextPath->SetFlags(IsPrototypeFlag, this->GetFlags());
        Assert(this->GetHasOnlyWritableDataProperties() == nextPath->GetHasOnlyWritableDataProperties() || !(key.GetAttributes() & ObjectSlotAttr_Writable) || (key.GetAttributes() & ObjectSlotAttr_Accessor));
        Assert(this->GetIsInlineSlotCapacityLocked() == nextPath->GetIsInlineSlotCapacityLocked());
        nextPath->SetPropertyTypes(PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, this->GetPropertyTypes());

        PropertyAttributes isWritableAttribute = ((key.GetAttributes() & ObjectSlotAttr_Writable) && !(key.GetAttributes() & ObjectSlotAttr_Accessor)) ? PropertyWritable : PropertyNone;
        library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(nextPath, isWritableAttribute, propertyRecord, scriptContext);
        library->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(nextPath, isWritableAttribute, propertyRecord, scriptContext);

        (*propertyIndex) = index;

#if DBG
        AssertMsg(nextPath->GetPredecessorType()->GetTypeHandler() == this, "Promoting this type to a successor with a different predecessor?");
#endif

        return nextType;
    }